

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int fs_makedir_recursive(char *path)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  char b;
  int i;
  int len;
  char buffer [2048];
  undefined4 in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7dc;
  undefined4 in_stack_fffffffffffff7e0;
  int iVar4;
  undefined4 in_stack_fffffffffffff7e4;
  int local_80c;
  char local_808 [2048];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str_copy((char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
           (char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),0);
  iVar2 = str_length((char *)0x1674af);
  iVar4 = 1;
  do {
    if (iVar2 <= iVar4) {
      local_80c = fs_makedir((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
LAB_00167546:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_80c;
      }
      __stack_chk_fail();
    }
    cVar1 = local_808[iVar4];
    in_stack_fffffffffffff7dc = CONCAT13(cVar1,(int3)in_stack_fffffffffffff7dc);
    if ((cVar1 == '/') || ((cVar1 == '\\' && (local_808[iVar4 + -1] != ':')))) {
      local_808[iVar4] = '\0';
      iVar3 = fs_makedir((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
      if (iVar3 < 0) {
        local_80c = -1;
        goto LAB_00167546;
      }
      local_808[iVar4] = (char)((uint)in_stack_fffffffffffff7dc >> 0x18);
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

int fs_makedir_recursive(const char *path)
{
	char buffer[2048];
	int len;
	int i;
	str_copy(buffer, path, sizeof(buffer));
	len = str_length(buffer);
	// ignore a leading slash
	for(i = 1; i < len; i++)
	{
		char b = buffer[i];
		if(b == '/' || (b == '\\' && buffer[i-1] != ':'))
		{
			buffer[i] = 0;
			if(fs_makedir(buffer) < 0)
			{
				return -1;
			}
			buffer[i] = b;

		}
	}
	return fs_makedir(path);
}